

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

nh_objitem * make_invlist(char *lets,int *icount)

{
  char *pcVar1;
  int iVar2;
  int id;
  char *pcVar3;
  nh_objitem *local_40;
  nh_objitem *items;
  char *invlet;
  int classcount;
  int cur_entry;
  int nr_items;
  char ilet;
  obj *otmp;
  int *icount_local;
  char *lets_local;
  
  classcount = 10;
  invlet._4_4_ = 0;
  items = (nh_objitem *)flags.inv_order;
  otmp = (obj *)icount;
  icount_local = (int *)lets;
  local_40 = (nh_objitem *)malloc(0xb68);
  while( true ) {
    do {
      invlet._0_4_ = 0;
      for (_nr_items = invent; _nr_items != (obj *)0x0; _nr_items = _nr_items->nobj) {
        cur_entry._3_1_ = _nr_items->invlet;
        if ((((icount_local == (int *)0x0) || ((char)*icount_local == '\0')) ||
            (pcVar3 = strchr((char *)icount_local,(int)cur_entry._3_1_), pcVar3 != (char *)0x0)) &&
           ((iVar2 = invlet._4_4_, flags.sortpack == '\0' ||
            (_nr_items->oclass == items->caption[0])))) {
          if ((flags.sortpack != '\0') && ((int)invlet == 0)) {
            invlet._4_4_ = invlet._4_4_ + 1;
            pcVar3 = let_to_name(items->caption[0],'\0');
            add_objitem(&local_40,&classcount,MI_HEADING,iVar2,0,pcVar3,_nr_items,'\0');
            invlet._0_4_ = (int)invlet + 1;
          }
          examine_object(_nr_items);
          iVar2 = invlet._4_4_;
          invlet._4_4_ = invlet._4_4_ + 1;
          id = (int)cur_entry._3_1_;
          pcVar3 = doname(_nr_items);
          add_objitem(&local_40,&classcount,MI_NORMAL,iVar2,id,pcVar3,_nr_items,'\x01');
        }
      }
      if (flags.sortpack == '\0') goto LAB_001f7220;
      pcVar3 = items->caption;
      pcVar1 = items->caption;
      items = (nh_objitem *)(pcVar3 + 1);
    } while (pcVar1[1] != '\0');
    if ((nh_objitem *)(pcVar3 + 1) == (nh_objitem *)0x36cff2) break;
    items = (nh_objitem *)venom_inv;
  }
LAB_001f7220:
  *(int *)&otmp->nobj = invlet._4_4_;
  return local_40;
}

Assistant:

static struct nh_objitem *make_invlist(const char *lets, int *icount)
{
	struct obj *otmp;
	char ilet;
	int nr_items = 10, cur_entry = 0, classcount;
	const char *invlet = flags.inv_order;
	struct nh_objitem *items = malloc(nr_items * sizeof(struct nh_objitem));

nextclass:
	classcount = 0;
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    ilet = otmp->invlet;
	    if (!lets || !*lets || strchr(lets, ilet)) {
		if (!flags.sortpack || otmp->oclass == *invlet) {
		    if (flags.sortpack && !classcount) {
			add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
				    let_to_name(*invlet, FALSE), otmp, FALSE);
			classcount++;
		    }
		    examine_object(otmp);
		    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, ilet,
				doname(otmp), otmp, TRUE);
		}
	    }
	}
	if (flags.sortpack) {
		if (*++invlet)
			goto nextclass;
		if (--invlet != venom_inv) {
			invlet = venom_inv;
			goto nextclass;
		}
	}

	*icount = cur_entry;
	return items;
}